

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap.h
# Opt level: O0

void * __thiscall TCMalloc_PageMap3<10>::Next(TCMalloc_PageMap3<10> *this,Number k)

{
  Node *pNVar1;
  ulong uVar2;
  Number i3;
  Leaf *leaf;
  Number i2;
  Number i1;
  Number k_local;
  TCMalloc_PageMap3<10> *this_local;
  
  k_local = k;
  do {
    while( true ) {
      if (0x3ff < k_local) {
        return (void *)0x0;
      }
      uVar2 = k_local >> 6;
      if ((this->root_).ptrs[uVar2] != (Node *)0x0) break;
      k_local = (uVar2 + 1) * 0x40;
    }
    pNVar1 = (this->root_).ptrs[uVar2]->ptrs[k_local >> 2 & 0xf];
    if (pNVar1 != (Node *)0x0) {
      for (i3 = k_local & 3; i3 < 4; i3 = i3 + 1) {
        if (pNVar1->ptrs[i3] != (Node *)0x0) {
          return pNVar1->ptrs[i3];
        }
      }
    }
    k_local = ((k_local >> 2) + 1) * 4;
  } while( true );
}

Assistant:

void* Next(Number k) const {
    while (k < (Number(1) << BITS)) {
      const Number i1 = k >> (LEAF_BITS + INTERIOR_BITS);
      const Number i2 = (k >> LEAF_BITS) & (INTERIOR_LENGTH-1);
      if (root_.ptrs[i1] == nullptr) {
        // Advance to next top-level entry
        k = (i1 + 1) << (LEAF_BITS + INTERIOR_BITS);
      } else {
        Leaf* leaf = reinterpret_cast<Leaf*>(root_.ptrs[i1]->ptrs[i2]);
        if (leaf != nullptr) {
          for (Number i3 = (k & (LEAF_LENGTH-1)); i3 < LEAF_LENGTH; i3++) {
            if (leaf->values[i3] != nullptr) {
              return leaf->values[i3];
            }
          }
        }
        // Advance to next interior entry
        k = ((k >> LEAF_BITS) + 1) << LEAF_BITS;
      }
    }
    return nullptr;
  }